

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Vec_Int_t * Gia_ManOrderWithBoxes(Gia_Man_t *p)

{
  uint iCiNum;
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint iBox;
  uint uVar4;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int local_48;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  if (p_00 == (Tim_Man_t *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                  ,0x11f,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  iVar1 = Gia_ManIsNormalized(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized( p )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                  ,0x120,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  p_01 = Vec_IntAlloc(p->nObjs);
  Vec_IntPush(p_01,0);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  iVar1 = 0;
  while (iVar2 = Tim_ManPiNum(p_00), iVar1 < iVar2) {
    pGVar5 = Gia_ManCi(p,iVar1);
    iVar2 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(p_01,iVar2);
    Gia_ObjSetTravIdCurrent(p,pGVar5);
    iVar2 = Gia_ObjId(p,pGVar5);
    iVar6 = iVar1 + 1;
    iVar1 = iVar2;
    if (iVar2 != iVar6) {
      __assert_fail("Gia_ObjId(p, pObj) == i+1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                    ,0x12e,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
    }
  }
  local_48 = Tim_ManPiNum(p_00);
  iVar1 = 0;
  for (uVar7 = 0; iVar2 = Tim_ManBoxNum(p_00), (int)uVar7 < iVar2; uVar7 = uVar7 + 1) {
    uVar8 = 0;
    while( true ) {
      iVar2 = Tim_ManBoxInputNum(p_00,uVar7);
      iVar6 = (int)uVar8;
      if (iVar2 <= iVar6) break;
      pGVar5 = Gia_ManCo(p,iVar1 + iVar6);
      iVar2 = Gia_ManOrderWithBoxes_rec
                        (p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),p_01);
      if (iVar2 != 0) {
        iCiNum = p->iData2;
        iBox = Tim_ManBoxFindFromCiNum(p_00,iCiNum);
        puts("The command has to terminate. Boxes are not in a topological order.");
        puts("The following information may help debugging (numbers are 0-based):");
        iVar1 = Tim_ManBoxOutputFirst(p_00,uVar7);
        uVar4 = Tim_ManBoxInputFirst(p_00,uVar7);
        printf("Input %d of BoxA %d (1stCI = %d; 1stCO = %d) has TFI with CI %d,\n",uVar8,
               (ulong)uVar7,iVar1,(ulong)uVar4,(ulong)iCiNum);
        iVar1 = Tim_ManBoxOutputFirst(p_00,iBox);
        uVar7 = Tim_ManBoxOutputFirst(p_00,iBox);
        uVar4 = Tim_ManBoxInputFirst(p_00,iBox);
        printf("which corresponds to output %d of BoxB %d (1stCI = %d; 1stCO = %d).\n",
               (ulong)(iCiNum - iVar1),(ulong)iBox,(ulong)uVar7,(ulong)uVar4);
        puts("In a correct topological order, BoxB should precede BoxA.");
        Vec_IntFree(p_01);
        p->iData2 = 0;
        return (Vec_Int_t *)0x0;
      }
      uVar8 = (ulong)(iVar6 + 1);
    }
    for (iVar2 = 0; iVar6 = Tim_ManBoxInputNum(p_00,uVar7), iVar2 < iVar6; iVar2 = iVar2 + 1) {
      pGVar5 = Gia_ManCo(p,iVar1 + iVar2);
      iVar6 = Gia_ObjId(p,pGVar5);
      Vec_IntPush(p_01,iVar6);
    }
    iVar2 = Tim_ManBoxInputNum(p_00,uVar7);
    for (iVar6 = 0; iVar3 = Tim_ManBoxOutputNum(p_00,uVar7), iVar6 < iVar3; iVar6 = iVar6 + 1) {
      pGVar5 = Gia_ManCi(p,local_48 + iVar6);
      iVar3 = Gia_ObjId(p,pGVar5);
      Vec_IntPush(p_01,iVar3);
      Gia_ObjSetTravIdCurrent(p,pGVar5);
    }
    iVar1 = iVar2 + iVar1;
    iVar2 = Tim_ManBoxOutputNum(p_00,uVar7);
    local_48 = iVar2 + local_48;
  }
  iVar2 = Tim_ManCoNum(p_00);
  iVar6 = Tim_ManPoNum(p_00);
  for (iVar2 = iVar2 - iVar6; iVar6 = Tim_ManCoNum(p_00), iVar2 < iVar6; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManCo(p,iVar2);
    Gia_ManOrderWithBoxes_rec(p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),p_01);
  }
  iVar2 = Tim_ManCoNum(p_00);
  iVar6 = Tim_ManPoNum(p_00);
  for (iVar2 = iVar2 - iVar6; iVar6 = Tim_ManCoNum(p_00), iVar2 < iVar6; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManCo(p,iVar2);
    iVar6 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(p_01,iVar6);
  }
  iVar2 = Tim_ManPoNum(p_00);
  if (local_48 == p->vCis->nSize) {
    if (iVar2 + iVar1 != p->vCos->nSize) {
      __assert_fail("curCo == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                    ,0x169,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
    }
    if (p_01->nSize == p->nObjs) {
      return p_01;
    }
    __assert_fail("Vec_IntSize(vNodes) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                  ,0x16a,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  __assert_fail("curCi == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                ,0x168,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManOrderWithBoxes( Gia_Man_t * p )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, k, curCi, curCo;
    assert( pManTime != NULL );
    assert( Gia_ManIsNormalized( p ) );
    // start trav IDs
    Gia_ManIncrementTravId( p );
    // start the array
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    // include constant
    Vec_IntPush( vNodes, 0 );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    // include primary inputs
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        Gia_ObjSetTravIdCurrent( p, pObj );
        assert( Gia_ObjId(p, pObj) == i+1 );
    }
    // for each box, include box nodes
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // add internal nodes
        for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            {
                int iCiNum  = p->iData2;
                int iBoxNum = Tim_ManBoxFindFromCiNum( pManTime, iCiNum );
                printf( "The command has to terminate. Boxes are not in a topological order.\n" );
                printf( "The following information may help debugging (numbers are 0-based):\n" );
                printf( "Input %d of BoxA %d (1stCI = %d; 1stCO = %d) has TFI with CI %d,\n", 
                    k, i, Tim_ManBoxOutputFirst(pManTime, i), Tim_ManBoxInputFirst(pManTime, i), iCiNum );
                printf( "which corresponds to output %d of BoxB %d (1stCI = %d; 1stCO = %d).\n", 
                    iCiNum - Tim_ManBoxOutputFirst(pManTime, iBoxNum), iBoxNum, 
                    Tim_ManBoxOutputFirst(pManTime, iBoxNum), Tim_ManBoxInputFirst(pManTime, iBoxNum) );
                printf( "In a correct topological order, BoxB should precede BoxA.\n" );
                Vec_IntFree( vNodes );
                p->iData2 = 0;
                return NULL;
            }
        }
        // add POs corresponding to box inputs
        for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        // add PIs corresponding to box outputs
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
        }
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes );
    }
    // add POs
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    assert( Vec_IntSize(vNodes) == Gia_ManObjNum(p) );
    return vNodes;
}